

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall
Nfa::dfs_del_loop(Nfa *this,int now,int *_index,
                 stack<int,_std::deque<int,_std::allocator<int>_>_> *stk,
                 vector<int,_std::allocator<int>_> *dfn,vector<int,_std::allocator<int>_> *low,
                 vector<int,_std::allocator<int>_> *belong)

{
  int *piVar1;
  ulong *puVar2;
  Fa_Node *pFVar3;
  pointer ppFVar4;
  pointer piVar5;
  byte bVar6;
  _Elt_pointer piVar7;
  ulong uVar8;
  bool bVar9;
  int *piVar10;
  pointer pEVar11;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  pointer pEVar15;
  int local_4c;
  pointer local_48;
  int *local_40;
  ulong local_38;
  
  iVar12 = *_index;
  (dfn->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start[now]
       = iVar12;
  (low->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start[now]
       = iVar12;
  *_index = *_index + 1;
  piVar7 = (stk->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_cur;
  local_4c = now;
  local_40 = _index;
  if (piVar7 == (stk->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
                ._M_finish._M_last + -1) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)stk,&local_4c);
  }
  else {
    *piVar7 = now;
    (stk->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
    _M_cur = piVar7 + 1;
  }
  uVar8 = (ulong)local_4c;
  uVar13 = uVar8 + 0x3f;
  if (-1 < (long)uVar8) {
    uVar13 = uVar8;
  }
  puVar2 = (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p +
           ((long)uVar13 >> 6) +
           (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar2 = *puVar2 | 1L << ((byte)local_4c & 0x3f);
  pFVar3 = (this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar8];
  pEVar15 = (pFVar3->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
            super__Vector_impl_data._M_start;
  pEVar11 = *(pointer *)
             ((long)&(pFVar3->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl + 8);
  if (pEVar15 != pEVar11) {
    local_38 = 0x800000000000003f;
    local_48 = pEVar11;
    do {
      if (pEVar15->c == '\0') {
        pFVar3 = pEVar15->v;
        ppFVar4 = (this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (ppFVar4[local_4c]->start == true) {
          ppFVar4[pFVar3->n]->start = true;
        }
        uVar13 = (ulong)pFVar3->n;
        piVar5 = (dfn->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar12 = piVar5[uVar13];
        if (iVar12 == 0) {
          dfs_del_loop(this,pFVar3->n,local_40,stk,dfn,low,belong);
          piVar5 = (low->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          iVar12 = piVar5[local_4c];
          if (piVar5[pFVar3->n] < piVar5[local_4c]) {
            iVar12 = piVar5[pFVar3->n];
          }
          piVar5[local_4c] = iVar12;
          pEVar11 = local_48;
        }
        else {
          uVar8 = uVar13 + 0x3f;
          if (-1 < (long)uVar13) {
            uVar8 = uVar13;
          }
          if (((this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)uVar8 >> 6) +
                (ulong)((uVar13 & local_38) < 0x8000000000000001) + 0xffffffffffffffff] >>
               (uVar13 & 0x3f) & 1) != 0) {
            piVar1 = (low->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start + local_4c;
            piVar10 = piVar5 + uVar13;
            if (*piVar1 <= iVar12) {
              piVar10 = piVar1;
            }
            *piVar1 = *piVar10;
          }
        }
        ppFVar4 = (this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (ppFVar4[pFVar3->n]->end == true) {
          ppFVar4[local_4c]->end = true;
        }
      }
      pEVar15 = pEVar15 + 1;
    } while (pEVar15 != pEVar11);
  }
  if ((dfn->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
      [local_4c] ==
      (low->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
      [local_4c]) {
    do {
      piVar7 = (stk->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
               _M_finish._M_cur;
      if (piVar7 == (stk->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur) {
        return;
      }
      if (piVar7 == (stk->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
        piVar7 = (stk->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
      }
      iVar12 = piVar7[-1];
      uVar8 = (ulong)iVar12;
      std::deque<int,_std::allocator<int>_>::pop_back(&stk->c);
      uVar13 = uVar8 + 0x3f;
      if (-1 < (long)uVar8) {
        uVar13 = uVar8;
      }
      bVar6 = (byte)iVar12 & 0x3f;
      puVar2 = (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
               ((long)uVar13 >> 6) +
               (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
      *puVar2 = *puVar2 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
      (belong->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar8] = local_4c;
      ppFVar4 = (this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pFVar3 = ppFVar4[local_4c];
      bVar9 = true;
      bVar14 = true;
      if (pFVar3->start == false) {
        bVar14 = ppFVar4[uVar8]->start;
      }
      pFVar3->start = bVar14;
      if (pFVar3->end == false) {
        bVar9 = ppFVar4[uVar8]->end;
      }
      pFVar3->end = bVar9;
    } while (iVar12 != local_4c);
  }
  return;
}

Assistant:

void
Nfa::dfs_del_loop(int now, int &_index, stack<int> &stk, vector<int> &dfn, vector<int> &low,
                  vector<int> &belong) {
    low[now] = dfn[now] = _index;
    _index++;
    stk.push(now);
    used[now] = true;
    for (auto i:Node[now]->edge) {
        if (i.c != '\0') {
            continue;
        }
        if (Node[now]->start) {
            Node[i.v->n]->start = true;
        }
        //start expand
        if (!dfn[i.v->n]) {
            dfs_del_loop(i.v->n, _index, stk, dfn, low, belong);
            low[now] = min(low[now], low[i.v->n]);
        } else if (used[i.v->n]) {
            low[now] = min(low[now], dfn[i.v->n]);
        }
        if (Node[i.v->n]->end) {
            Node[now]->end = true;
        }
        //end expand
    }
    if (dfn[now] == low[now]) {
        while (!stk.empty()) {
            int u = stk.top();
            stk.pop();
            used[u] = false;
            belong[u] = now;

            Node[now]->start = Node[now]->start || Node[u]->start;
            Node[now]->end = Node[now]->end || Node[u]->end;

            if (u == now) {
                break;
            }
        }
    }
}